

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

void __thiscall
chaiscript::detail::Dispatch_Engine::dump_type(Dispatch_Engine *this,Type_Info *type)

{
  bool bVar1;
  ostream *poVar2;
  Type_Info *in_RSI;
  char *pcVar3;
  Type_Info *unaff_retaddr;
  Dispatch_Engine *in_stack_00000008;
  string local_30 [48];
  
  bVar1 = Type_Info::is_const(in_RSI);
  pcVar3 = "";
  if (bVar1) {
    pcVar3 = "const ";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
  get_type_name_abi_cxx11_(in_stack_00000008,unaff_retaddr);
  std::operator<<(poVar2,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void dump_type(const Type_Info &type) const
        {
          std::cout << (type.is_const()?"const ":"") << get_type_name(type);
        }